

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_clone_alloc(wally_tx *tx,uint32_t flags,wally_tx **output)

{
  _Bool _Var1;
  bool bVar2;
  int local_3c;
  wally_tx *pwStack_38;
  int ret;
  wally_tx *result;
  size_t i;
  wally_tx **output_local;
  wally_tx *pwStack_18;
  uint32_t flags_local;
  wally_tx *tx_local;
  
  pwStack_38 = (wally_tx *)0x0;
  if (output == (wally_tx **)0x0) {
    tx_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx *)0x0;
    i = (size_t)output;
    output_local._4_4_ = flags;
    pwStack_18 = tx;
    _Var1 = is_valid_tx(tx);
    if ((_Var1) && (output_local._4_4_ == 0)) {
      local_3c = wally_tx_init_alloc(pwStack_18->version,pwStack_18->locktime,pwStack_18->num_inputs
                                     ,pwStack_18->num_outputs,&stack0xffffffffffffffc8);
      result = (wally_tx *)0x0;
      while( true ) {
        bVar2 = false;
        if (local_3c == 0) {
          bVar2 = result < (wally_tx *)pwStack_18->num_inputs;
        }
        if (!bVar2) break;
        local_3c = wally_tx_add_input(pwStack_38,pwStack_18->inputs + (long)result);
        result = (wally_tx *)((long)&result->version + 1);
      }
      result = (wally_tx *)0x0;
      while( true ) {
        bVar2 = false;
        if (local_3c == 0) {
          bVar2 = result < (wally_tx *)pwStack_18->num_outputs;
        }
        if (!bVar2) break;
        local_3c = wally_tx_add_output(pwStack_38,pwStack_18->outputs + (long)result);
        result = (wally_tx *)((long)&result->version + 1);
      }
      if (local_3c == 0) {
        *(wally_tx **)i = pwStack_38;
      }
      else {
        wally_tx_free(pwStack_38);
      }
      tx_local._4_4_ = local_3c;
    }
    else {
      tx_local._4_4_ = -2;
    }
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_clone_alloc(const struct wally_tx *tx, uint32_t flags, struct wally_tx **output)
{
    size_t i;
    struct wally_tx *result = NULL;
    int ret;

    TX_CHECK_OUTPUT;

    if (!is_valid_tx(tx) || flags != 0)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(tx->version, tx->locktime, tx->num_inputs, tx->num_outputs, &result);

    for (i = 0; ret == WALLY_OK && i < tx->num_inputs; ++i)
        ret = wally_tx_add_input(result, &tx->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < tx->num_outputs; ++i)
        ret = wally_tx_add_output(result, &tx->outputs[i]);

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);

    return ret;
}